

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

DescriptorProto * __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::Add
          (RepeatedPtrField<google::protobuf::DescriptorProto> *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  DescriptorProto *pDVar4;
  
  iVar2 = (this->super_RepeatedPtrFieldBase).current_size_;
  iVar3 = (this->super_RepeatedPtrFieldBase).allocated_size_;
  if (iVar2 < iVar3) {
    (this->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
    pDVar4 = (DescriptorProto *)(this->super_RepeatedPtrFieldBase).elements_[iVar2];
  }
  else {
    iVar2 = (this->super_RepeatedPtrFieldBase).total_size_;
    if (iVar3 == iVar2) {
      internal::RepeatedPtrFieldBase::Reserve(&this->super_RepeatedPtrFieldBase,iVar2 + 1);
    }
    piVar1 = &(this->super_RepeatedPtrFieldBase).allocated_size_;
    *piVar1 = *piVar1 + 1;
    pDVar4 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
    iVar2 = (this->super_RepeatedPtrFieldBase).current_size_;
    (this->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
    (this->super_RepeatedPtrFieldBase).elements_[iVar2] = pDVar4;
  }
  return pDVar4;
}

Assistant:

inline Element* RepeatedPtrField<Element>::Add() {
  return RepeatedPtrFieldBase::Add<TypeHandler>();
}